

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O3

void __thiscall uv::AcceptClient::Close(AcceptClient *this)

{
  char *pcVar1;
  TcpClientCtx *pTVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ILog4zManager *pIVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  ulong *in_FS_OFFSET;
  
  if (this->isclosed_ != false) {
    return;
  }
  pTVar2 = this->client_handle_;
  (pTVar2->tcphandle).data = this;
  uv_close(pTVar2,AfterClientClose);
  pcVar3 = (char *)*in_FS_OFFSET;
  pcVar1 = pcVar3 + -0x800;
  builtin_strncpy(pcVar3 + -0x800,"client(",8);
  uVar4 = snprintf(pcVar3 + -0x7f9,0x7f9,"%016llx",this);
  iVar9 = (int)pcVar3;
  if ((int)uVar4 < 0) {
    pcVar3[-0x7f9] = '\0';
    pcVar10 = pcVar1;
LAB_00116f75:
    pcVar10 = pcVar10 + 7;
    iVar11 = iVar9 - (int)pcVar10;
    iVar5 = snprintf(pcVar10,(long)iVar11,"%s",")close");
    pcVar8 = pcVar10;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_00116fb2:
      iVar5 = iVar6;
      *pcVar8 = '\0';
    }
    else if (iVar11 <= iVar5) {
      pcVar8 = pcVar3 + -1;
      iVar6 = iVar11;
      goto LAB_00116fb2;
    }
    pcVar10 = pcVar10 + iVar5;
  }
  else {
    if (uVar4 < 0x7f9) {
      pcVar10 = pcVar1 + uVar4;
      goto LAB_00116f75;
    }
    pcVar3[-1] = '\0';
    pcVar10 = pcVar3;
  }
  if (pcVar10 < pcVar3) {
    iVar11 = iVar9 - (int)pcVar10;
    iVar5 = snprintf(pcVar10,(long)iVar11,"%s"," ( ");
    pcVar8 = pcVar10;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_00117006:
      iVar5 = iVar6;
      *pcVar8 = '\0';
    }
    else if (iVar11 <= iVar5) {
      pcVar8 = pcVar3 + -1;
      iVar6 = iVar11;
      goto LAB_00117006;
    }
    pcVar10 = pcVar10 + iVar5;
  }
  if (pcVar10 < pcVar3) {
    iVar11 = iVar9 - (int)pcVar10;
    iVar5 = snprintf(pcVar10,(long)iVar11,"%s"," ");
    pcVar8 = pcVar10;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_0011704e:
      iVar5 = iVar6;
      *pcVar8 = '\0';
    }
    else if (iVar11 <= iVar5) {
      pcVar8 = pcVar3 + -1;
      iVar6 = iVar11;
      goto LAB_0011704e;
    }
    pcVar10 = pcVar10 + iVar5;
  }
  if (pcVar10 < pcVar3) {
    iVar11 = iVar9 - (int)pcVar10;
    iVar5 = snprintf(pcVar10,(long)iVar11,"%s"," ) : ");
    pcVar8 = pcVar10;
    iVar6 = 0;
    if (iVar5 < 0) {
LAB_00117096:
      iVar5 = iVar6;
      *pcVar8 = '\0';
    }
    else if (iVar11 <= iVar5) {
      pcVar8 = pcVar3 + -1;
      iVar6 = iVar11;
      goto LAB_00117096;
    }
    pcVar10 = pcVar10 + iVar5;
  }
  if (pcVar10 < pcVar3) {
    iVar9 = iVar9 - (int)pcVar10;
    iVar6 = snprintf(pcVar10,(long)iVar9,"%d",0x218);
    if (-1 < iVar6) {
      if (iVar6 < iVar9) goto LAB_001170d8;
      pcVar10 = pcVar3 + -1;
    }
    *pcVar10 = '\0';
  }
LAB_001170d8:
  pIVar7 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar7->_vptr_ILog4zManager[8])(pIVar7,0,1,pcVar1,pIVar7->_vptr_ILog4zManager[8]);
  return;
}

Assistant:

void AcceptClient::Close()
{
    if (isclosed_) {
        return;
    }
    client_handle_->tcphandle.data = this;
    //send close command
    uv_close((uv_handle_t*)&client_handle_->tcphandle, AfterClientClose);
    LOGI("client(" << this << ")close");
}